

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int y4m_parse_tags(y4m_input *_y4m,char *_tags)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  char *q;
  char *p;
  char *local_28;
  char *local_20;
  
  local_20 = in_RSI;
  while( true ) {
    for (; *local_20 == ' '; local_20 = local_20 + 1) {
    }
    local_28 = local_20;
    if (*local_20 == '\0') break;
    do {
      local_28 = local_28 + 1;
      bVar2 = false;
      if (*local_28 != '\0') {
        bVar2 = *local_28 != ' ';
      }
    } while (bVar2);
    switch((y4m_input *)(ulong)((int)*local_20 - 0x41)) {
    case (y4m_input *)0x0:
      iVar1 = __isoc99_sscanf(local_20 + 1,"%d:%d",in_RDI + 0x10,in_RDI + 0x14);
      if (iVar1 != 2) {
        return -1;
      }
      break;
    default:
      break;
    case (y4m_input *)0x2:
      if (0x10 < (long)local_28 - (long)local_20) {
        return -1;
      }
      memcpy((void *)(in_RDI + 0x2c),local_20 + 1,(size_t)(local_28 + (-1 - (long)local_20)));
      local_28[in_RDI + (0x2b - (long)local_20)] = '\0';
      break;
    case (y4m_input *)0x5:
      iVar1 = __isoc99_sscanf(local_20 + 1,"%d:%d",in_RDI + 8,in_RDI + 0xc);
      if (iVar1 != 2) {
        return -1;
      }
      break;
    case (y4m_input *)0x7:
      iVar1 = __isoc99_sscanf(local_20 + 1,"%d",in_RDI + 4);
      if (iVar1 != 1) {
        return -1;
      }
      break;
    case (y4m_input *)0x8:
      *(char *)(in_RDI + 0x18) = local_20[1];
      break;
    case (y4m_input *)0x16:
      iVar1 = __isoc99_sscanf(local_20 + 1,"%d",in_RDI);
      if (iVar1 != 1) {
        return -1;
      }
      break;
    case (y4m_input *)0x17:
      iVar1 = parse_metadata((y4m_input *)(ulong)((int)*local_20 - 0x41),(char *)0x12ff9d);
      if (iVar1 == 0) {
        return -1;
      }
    }
    local_20 = local_28;
  }
  return 0;
}

Assistant:

static int y4m_parse_tags(y4m_input *_y4m, char *_tags) {
  char *p;
  char *q;
  for (p = _tags;; p = q) {
    /*Skip any leading spaces.*/
    while (*p == ' ') p++;
    /*If that's all we have, stop.*/
    if (p[0] == '\0') break;
    /*Find the end of this tag.*/
    for (q = p + 1; *q != '\0' && *q != ' '; q++) {
    }
    /*Process the tag.*/
    switch (p[0]) {
      case 'W': {
        if (sscanf(p + 1, "%d", &_y4m->pic_w) != 1) return -1;
      } break;
      case 'H': {
        if (sscanf(p + 1, "%d", &_y4m->pic_h) != 1) return -1;
      } break;
      case 'F': {
        if (sscanf(p + 1, "%d:%d", &_y4m->fps_n, &_y4m->fps_d) != 2) {
          return -1;
        }
      } break;
      case 'I': {
        _y4m->interlace = p[1];
      } break;
      case 'A': {
        if (sscanf(p + 1, "%d:%d", &_y4m->par_n, &_y4m->par_d) != 2) {
          return -1;
        }
      } break;
      case 'C': {
        if (q - p > 16) return -1;
        memcpy(_y4m->chroma_type, p + 1, q - p - 1);
        _y4m->chroma_type[q - p - 1] = '\0';
      } break;
      case 'X': {
        if (!parse_metadata(_y4m, p + 1)) return -1;
      } break;
      default: break; /*Ignore unknown tags.*/
    }
  }
  return 0;
}